

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void initialize_imputer<InputData<double,int>,double>
               (Imputer *imputer,InputData<double,_int> *input_data,size_t ntrees,int nthreads)

{
  vector<double,_std::allocator<double>_> *this;
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  int *piVar5;
  pointer piVar6;
  pointer __s;
  pointer pvVar7;
  undefined4 in_register_0000000c;
  long lVar8;
  ulong uVar9;
  pointer *ppIVar10;
  long lVar11;
  pointer *ppIVar12;
  pointer pvVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cat_counts;
  allocator_type local_81;
  vector<int,_std::allocator<int>_> *local_80;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  local_78;
  pointer *local_60;
  int *local_58;
  int *local_50;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  local_48;
  
  imputer->ncols_numeric = input_data->ncols_numeric;
  sVar15 = input_data->ncols_categ;
  imputer->ncols_categ = sVar15;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&imputer->ncat,input_data->ncat,
             input_data->ncat + sVar15,CONCAT44(in_register_0000000c,nthreads));
  this = &imputer->col_means;
  if ((imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.
    super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (this,input_data->ncols_numeric,(value_type_conflict *)&local_78);
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(this,input_data->ncols_numeric);
    pdVar2 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar2 != pdVar3) {
      memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
    }
  }
  local_80 = &imputer->col_modes;
  std::vector<int,_std::allocator<int>_>::resize(local_80,input_data->ncols_categ);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::vector(&local_48,ntrees,&local_81);
  local_78.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&local_48);
  pdVar4 = input_data->numeric_data;
  if (pdVar4 == (double *)0x0) {
    piVar5 = input_data->Xc_indptr;
    if ((piVar5 != (int *)0x0) && (input_data->ncols_numeric != 0)) {
      uVar14 = 0;
      do {
        sVar15 = input_data->nrows;
        lVar8 = (long)piVar5[uVar14];
        iVar1 = piVar5[uVar14 + 1];
        if (piVar5[uVar14] < iVar1) {
          pdVar4 = input_data->Xc;
          pdVar2 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar18 = pdVar2[uVar14];
          do {
            dVar21 = pdVar4[lVar8];
            if (0x7fefffffffffffff < (ulong)ABS(dVar21)) {
              dVar21 = 0.0;
            }
            dVar18 = dVar18 + dVar21;
            pdVar2[uVar14] = dVar18;
            sVar15 = sVar15 - (0x7fefffffffffffff < (ulong)ABS(pdVar4[lVar8]));
            lVar8 = lVar8 + 1;
          } while (iVar1 != lVar8);
        }
        auVar20._8_4_ = (int)(sVar15 >> 0x20);
        auVar20._0_8_ = sVar15;
        auVar20._12_4_ = 0x45300000;
        pdVar2 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar18 = NAN;
        if (sVar15 != 0) {
          dVar18 = pdVar2[uVar14] /
                   ((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar15) - 4503599627370496.0));
        }
        pdVar2[uVar14] = dVar18;
        uVar14 = uVar14 + 1;
      } while (uVar14 < input_data->ncols_numeric);
    }
  }
  else if (input_data->ncols_numeric != 0) {
    lVar8 = 0;
    uVar14 = 0;
    do {
      sVar15 = input_data->nrows;
      if (sVar15 == 0) {
        sVar16 = 0;
      }
      else {
        pdVar2 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar18 = pdVar2[uVar14];
        sVar17 = 0;
        sVar16 = sVar15;
        do {
          dVar21 = *(double *)((long)pdVar4 + sVar17 * 8 + sVar15 * lVar8);
          if (0x7fefffffffffffff < (ulong)ABS(dVar21)) {
            dVar21 = 0.0;
          }
          dVar18 = dVar18 + dVar21;
          pdVar2[uVar14] = dVar18;
          sVar16 = sVar16 - (0x7fefffffffffffff <
                            (*(ulong *)((long)pdVar4 + sVar17 * 8 + sVar15 * lVar8) &
                            0x7fffffffffffffff));
          sVar17 = sVar17 + 1;
        } while (sVar15 != sVar17);
      }
      auVar19._8_4_ = (int)(sVar16 >> 0x20);
      auVar19._0_8_ = sVar16;
      auVar19._12_4_ = 0x45300000;
      pdVar2 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar18 = NAN;
      if (sVar16 != 0) {
        dVar18 = pdVar2[uVar14] /
                 ((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar16) - 4503599627370496.0));
      }
      pdVar2[uVar14] = dVar18;
      uVar14 = uVar14 + 1;
      lVar8 = lVar8 + 8;
    } while (uVar14 < input_data->ncols_numeric);
  }
  if (input_data->categ_data != (int *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               (long)input_data->max_categ,(allocator_type *)&local_48);
    pvVar7 = local_78.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __s = local_78.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (input_data->ncols_categ != 0) {
      local_58 = input_data->categ_data;
      local_50 = input_data->ncat;
      local_60 = &((local_78.
                    super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      piVar6 = (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_80 = (vector<int,_std::allocator<int>_> *)
                 (((long)local_78.
                         super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish +
                   (-8 - (long)local_78.
                               super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8
                 );
      lVar8 = 0;
      uVar14 = 0;
      do {
        if (__s != pvVar7) {
          memset(__s,0,(size_t)local_80);
        }
        if (input_data->nrows != 0) {
          sVar15 = input_data->nrows;
          uVar9 = 0;
          do {
            lVar11 = (long)*(int *)((long)local_58 + uVar9 * 4 + sVar15 * lVar8);
            if (-1 < lVar11) {
              ppIVar10 = &(__s->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar11;
              *ppIVar10 = (pointer)((long)&((*ppIVar10)->num_sum).
                                           super__Vector_base<double,_std::allocator<double>_> + 1);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < input_data->nrows);
        }
        ppIVar10 = (pointer *)__s;
        if (1 < (ulong)(long)local_50[uVar14]) {
          lVar11 = (long)local_50[uVar14] * 8 + -8;
          ppIVar12 = local_60;
          pvVar13 = __s;
          do {
            ppIVar10 = ppIVar12;
            if (*ppIVar12 <=
                (pvVar13->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              ppIVar10 = (pointer *)pvVar13;
            }
            ppIVar12 = ppIVar12 + 1;
            lVar11 = lVar11 + -8;
            pvVar13 = (pointer)ppIVar10;
          } while (lVar11 != 0);
        }
        piVar6[uVar14] = (int)((ulong)((long)ppIVar10 - (long)__s) >> 3);
        uVar14 = uVar14 + 1;
        lVar8 = lVar8 + 4;
      } while (uVar14 < input_data->ncols_categ);
    }
    if (local_78.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void initialize_imputer(Imputer &imputer, InputData &input_data, size_t ntrees, int nthreads)
{
    imputer.ncols_numeric  =  input_data.ncols_numeric;
    imputer.ncols_categ    =  input_data.ncols_categ;
    imputer.ncat.assign(input_data.ncat, input_data.ncat + input_data.ncols_categ);
    if (imputer.col_means.size())
    {
        imputer.col_means.resize(input_data.ncols_numeric);
        std::fill(imputer.col_means.begin(), imputer.col_means.end(), 0);
    }

    else
    {
        imputer.col_means.resize(input_data.ncols_numeric, 0);
    }

    imputer.col_modes.resize(input_data.ncols_categ);
    imputer.imputer_tree = std::vector<std::vector<ImputeNode>>(ntrees);

    /* TODO: here should use sample weights if specified as density */
    size_t offset, cnt;
    if (input_data.numeric_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) private(cnt, offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt    = input_data.nrows;
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.numeric_data[row + offset]))?
                                           input_data.numeric_data[row + offset] : 0;
                cnt -= is_na_or_inf(input_data.numeric_data[row + offset]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    else if (input_data.Xc_indptr != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) private(cnt) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt = input_data.nrows;
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.Xc[ix]))?
                                           input_data.Xc[ix] : 0;
                cnt -= is_na_or_inf(input_data.Xc[ix]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    if (input_data.categ_data != NULL)
    {
        std::vector<size_t> cat_counts(input_data.max_categ);
        #pragma omp parallel for schedule(static) num_threads(nthreads) firstprivate(cat_counts) private(offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_categ; col++)
        {
            std::fill(cat_counts.begin(), cat_counts.end(), 0);
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                if (input_data.categ_data[row + offset] >= 0)
                    cat_counts[input_data.categ_data[row + offset]]++;
            }
            imputer.col_modes[col] = (int) std::distance(cat_counts.begin(),
                                                         std::max_element(cat_counts.begin(),
                                                                           cat_counts.begin() + input_data.ncat[col]));
        }
    }
}